

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

int Eigen::internal::find_ordering<int>
              (int n_row,int n_col,int Alen,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,
              int *head,int n_col2,int max_deg,int pfree)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int row_start;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  uint uVar11;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_cc;
  int ngarbage;
  int next_col;
  int prev_col;
  int pivot_col_thickness;
  int max_mark;
  int col_thickness;
  int min_score;
  int set_difference;
  int row_mark;
  int tag_mark;
  int first_col;
  int head_column;
  uint hash;
  int cur_score;
  int max_score;
  int col;
  int row;
  int *rp_end;
  int *cp_end;
  int needed_memory;
  int pivot_col_score;
  int pivot_row_length;
  int pivot_row_degree;
  int pivot_row_start;
  int *new_rp;
  int *new_cp;
  int *piStack_48;
  int pivot_row;
  int *rp;
  int *cp;
  int pivot_col;
  int k;
  int *A_local;
  colamd_col<int> *Col_local;
  Colamd_Row<int> *Row_local;
  int Alen_local;
  int n_col_local;
  int n_row_local;
  
  set_difference = clear_mark<int>(n_row,Row);
  max_mark = 0;
  local_cc = 0;
  cp._4_4_ = 0;
  while (cp._4_4_ < n_col2) {
    for (; head[max_mark] == -1 && max_mark < n_col; max_mark = max_mark + 1) {
    }
    iVar1 = head[max_mark];
    iVar5 = Col[iVar1].shared4.degree_next;
    head[max_mark] = iVar5;
    if (iVar5 != -1) {
      Col[iVar5].shared3.headhash = -1;
    }
    local_d4 = Col[iVar1].shared2.score;
    Col[iVar1].shared2.score = cp._4_4_;
    iVar5 = Col[iVar1].shared1.thickness;
    cp._4_4_ = iVar5 + cp._4_4_;
    if (n_col - cp._4_4_ <= local_d4) {
      local_d4 = n_col - cp._4_4_;
    }
    if (Alen <= pfree + local_d4) {
      pfree = garbage_collection<int>(n_row,n_col,Row,Col,A,A + pfree);
      local_cc = local_cc + 1;
      set_difference = clear_mark<int>(n_row,Row);
    }
    row_start = pfree;
    pivot_col_score = 0;
    Col[iVar1].shared1.thickness = -iVar5;
    iVar8 = Col[iVar1].start;
    iVar2 = Col[iVar1].length;
    rp = A + iVar8;
    while (rp < A + iVar8 + iVar2) {
      piVar9 = rp + 1;
      iVar7 = *rp;
      rp = piVar9;
      if (-1 < Row[iVar7].shared2.mark) {
        iVar3 = Row[iVar7].start;
        iVar7 = Row[iVar7].length;
        piStack_48 = A + iVar3;
        while (piStack_48 < A + iVar3 + iVar7) {
          piVar9 = piStack_48 + 1;
          iVar6 = *piStack_48;
          iVar4 = Col[iVar6].shared1.thickness;
          piStack_48 = piVar9;
          if ((0 < iVar4) && (-1 < Col[iVar6].start)) {
            Col[iVar6].shared1.thickness = -iVar4;
            A[pfree] = iVar6;
            pivot_col_score = iVar4 + pivot_col_score;
            pfree = pfree + 1;
          }
        }
      }
    }
    Col[iVar1].shared1.thickness = iVar5;
    if (pivot_col_score < max_deg) {
      local_d8 = max_deg;
    }
    else {
      local_d8 = pivot_col_score;
    }
    max_deg = local_d8;
    iVar5 = Col[iVar1].start;
    iVar8 = Col[iVar1].length;
    rp = A + iVar5;
    while (rp < A + iVar5 + iVar8) {
      Row[*rp].shared2.mark = -1;
      rp = rp + 1;
    }
    iVar5 = pfree - row_start;
    if (iVar5 < 1) {
      new_cp._4_4_ = -1;
    }
    else {
      new_cp._4_4_ = A[Col[iVar1].start];
    }
    piStack_48 = A + row_start;
    while (piStack_48 < A + row_start + iVar5) {
      piVar9 = piStack_48 + 1;
      iVar8 = *piStack_48;
      iVar2 = Col[iVar8].shared1.thickness;
      Col[iVar8].shared1.thickness = -iVar2;
      iVar7 = Col[iVar8].shared3.headhash;
      iVar3 = Col[iVar8].shared4.degree_next;
      if (iVar7 == -1) {
        head[Col[iVar8].shared2.score] = iVar3;
      }
      else {
        Col[iVar7].shared4.degree_next = iVar3;
      }
      if (iVar3 != -1) {
        Col[iVar3].shared3.headhash = iVar7;
      }
      iVar7 = Col[iVar8].start;
      iVar8 = Col[iVar8].length;
      rp = A + iVar7;
      while (piStack_48 = piVar9, rp < A + iVar7 + iVar8) {
        piVar10 = rp + 1;
        iVar3 = *rp;
        rp = piVar10;
        if (-1 < Row[iVar3].shared2.mark) {
          col_thickness = Row[iVar3].shared2.mark - set_difference;
          if (col_thickness < 0) {
            col_thickness = Row[iVar3].shared1.degree;
          }
          iVar6 = col_thickness + iVar2;
          if (iVar6 == 0) {
            Row[iVar3].shared2.mark = -1;
          }
          else {
            Row[iVar3].shared2.mark = iVar6 + set_difference;
          }
        }
      }
    }
    piStack_48 = A + row_start;
    while (piStack_48 < A + row_start + iVar5) {
      iVar8 = *piStack_48;
      first_col = 0;
      head_column = 0;
      piVar9 = A + Col[iVar8].start;
      iVar2 = Col[iVar8].length;
      new_rp = piVar9;
      rp = piVar9;
      while (rp < piVar9 + iVar2) {
        piVar10 = rp + 1;
        iVar7 = *rp;
        iVar3 = Row[iVar7].shared2.mark;
        rp = piVar10;
        if (-1 < iVar3) {
          *new_rp = iVar7;
          first_col = iVar7 + first_col;
          iVar7 = (iVar3 - set_difference) + head_column;
          local_dc = n_col;
          if (iVar7 < n_col) {
            local_dc = iVar7;
          }
          head_column = local_dc;
          new_rp = new_rp + 1;
        }
      }
      Col[iVar8].length = (int)((long)new_rp - (long)(A + Col[iVar8].start) >> 2);
      if (Col[iVar8].length == 0) {
        Col[iVar8].start = -1;
        pivot_col_score = pivot_col_score - Col[iVar8].shared1.thickness;
        Col[iVar8].shared2.score = cp._4_4_;
        cp._4_4_ = Col[iVar8].shared1.thickness + cp._4_4_;
        piStack_48 = piStack_48 + 1;
      }
      else {
        Col[iVar8].shared2.score = head_column;
        uVar11 = (uint)first_col % (n_col + 1U);
        iVar2 = head[uVar11];
        if (iVar2 < 0) {
          row_mark = -(iVar2 + 2);
          head[uVar11] = -(iVar8 + 2);
        }
        else {
          row_mark = Col[iVar2].shared3.headhash;
          Col[iVar2].shared3.headhash = iVar8;
        }
        Col[iVar8].shared4.degree_next = row_mark;
        Col[iVar8].shared3.headhash = uVar11;
        piStack_48 = piStack_48 + 1;
      }
    }
    detect_super_cols<int>(Col,A,head,row_start,iVar5);
    Col[iVar1].start = -1;
    set_difference = local_d8 + 1 + set_difference;
    if (0x7fffffff - n_col <= set_difference) {
      set_difference = clear_mark<int>(n_row,Row);
    }
    piVar9 = A + row_start;
    _pivot_row_degree = piVar9;
    piStack_48 = piVar9;
    while (piStack_48 < piVar9 + iVar5) {
      piVar10 = piStack_48 + 1;
      iVar1 = *piStack_48;
      piStack_48 = piVar10;
      if (-1 < Col[iVar1].start) {
        *_pivot_row_degree = iVar1;
        iVar8 = Col[iVar1].start;
        iVar2 = Col[iVar1].length;
        Col[iVar1].length = iVar2 + 1;
        A[iVar8 + iVar2] = new_cp._4_4_;
        local_e0 = (n_col - cp._4_4_) - Col[iVar1].shared1.thickness;
        iVar8 = (Col[iVar1].shared2.score + pivot_col_score) - Col[iVar1].shared1.thickness;
        if (iVar8 < local_e0) {
          local_e0 = iVar8;
        }
        Col[iVar1].shared2.score = local_e0;
        iVar8 = head[local_e0];
        Col[iVar1].shared4.degree_next = iVar8;
        Col[iVar1].shared3.headhash = -1;
        if (iVar8 != -1) {
          Col[iVar8].shared3.headhash = iVar1;
        }
        head[local_e0] = iVar1;
        if (max_mark < local_e0) {
          local_e4 = max_mark;
        }
        else {
          local_e4 = local_e0;
        }
        max_mark = local_e4;
        _pivot_row_degree = _pivot_row_degree + 1;
      }
    }
    if (0 < pivot_col_score) {
      Row[new_cp._4_4_].start = row_start;
      Row[new_cp._4_4_].length = (int)((long)_pivot_row_degree - (long)(A + row_start) >> 2);
      Row[new_cp._4_4_].shared1.degree = pivot_col_score;
      Row[new_cp._4_4_].shared2.mark = 0;
    }
  }
  return local_cc;
}

Assistant:

static Index find_ordering /* return the number of garbage collections */
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Index Alen,     /* size of A, 2*nnz + n_col or larger */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* column form and row form of A */
    Index head [],    /* of size n_col+1 */
    Index n_col2,     /* Remaining columns to order */
    Index max_deg,    /* Maximum row degree */
    Index pfree     /* index of first free slot (2*nnz on entry) */
    )
{
  /* === Local variables ================================================== */

  Index k ;     /* current pivot ordering step */
  Index pivot_col ;   /* current pivot column */
  Index *cp ;     /* a column pointer */
  Index *rp ;     /* a row pointer */
  Index pivot_row ;   /* current pivot row */
  Index *new_cp ;   /* modified column pointer */
  Index *new_rp ;   /* modified row pointer */
  Index pivot_row_start ; /* pointer to start of pivot row */
  Index pivot_row_degree ;  /* number of columns in pivot row */
  Index pivot_row_length ;  /* number of supercolumns in pivot row */
  Index pivot_col_score ; /* score of pivot column */
  Index needed_memory ;   /* free space needed for pivot row */
  Index *cp_end ;   /* pointer to the end of a column */
  Index *rp_end ;   /* pointer to the end of a row */
  Index row ;     /* a row index */
  Index col ;     /* a column index */
  Index max_score ;   /* maximum possible score */
  Index cur_score ;   /* score of current column */
  unsigned int hash ;   /* hash value for supernode detection */
  Index head_column ;   /* head of hash bucket */
  Index first_col ;   /* first column in hash bucket */
  Index tag_mark ;    /* marker value for mark array */
  Index row_mark ;    /* Row [row].shared2.mark */
  Index set_difference ;  /* set difference size of row with pivot row */
  Index min_score ;   /* smallest column score */
  Index col_thickness ;   /* "thickness" (no. of columns in a supercol) */
  Index max_mark ;    /* maximum value of tag_mark */
  Index pivot_col_thickness ; /* number of columns represented by pivot col */
  Index prev_col ;    /* Used by Dlist operations. */
  Index next_col ;    /* Used by Dlist operations. */
  Index ngarbage ;    /* number of garbage collections performed */


  /* === Initialization and clear mark ==================================== */

  max_mark = INT_MAX - n_col ;  /* INT_MAX defined in <limits.h> */
  tag_mark = Eigen::internal::clear_mark (n_row, Row) ;
  min_score = 0 ;
  ngarbage = 0 ;
  COLAMD_DEBUG1 (("colamd: Ordering, n_col2=%d\n", n_col2)) ;

  /* === Order the columns ================================================ */

  for (k = 0 ; k < n_col2 ; /* 'k' is incremented below */)
  {

    /* === Select pivot column, and order it ============================ */

    /* make sure degree list isn't empty */
    COLAMD_ASSERT (min_score >= 0) ;
    COLAMD_ASSERT (min_score <= n_col) ;
    COLAMD_ASSERT (head [min_score] >= COLAMD_EMPTY) ;

    /* get pivot column from head of minimum degree list */
    while (head [min_score] == COLAMD_EMPTY && min_score < n_col)
    {
      min_score++ ;
    }
    pivot_col = head [min_score] ;
    COLAMD_ASSERT (pivot_col >= 0 && pivot_col <= n_col) ;
    next_col = Col [pivot_col].shared4.degree_next ;
    head [min_score] = next_col ;
    if (next_col != COLAMD_EMPTY)
    {
      Col [next_col].shared3.prev = COLAMD_EMPTY ;
    }

    COLAMD_ASSERT (COL_IS_ALIVE (pivot_col)) ;
    COLAMD_DEBUG3 (("Pivot col: %d\n", pivot_col)) ;

    /* remember score for defrag check */
    pivot_col_score = Col [pivot_col].shared2.score ;

    /* the pivot column is the kth column in the pivot order */
    Col [pivot_col].shared2.order = k ;

    /* increment order count by column thickness */
    pivot_col_thickness = Col [pivot_col].shared1.thickness ;
    k += pivot_col_thickness ;
    COLAMD_ASSERT (pivot_col_thickness > 0) ;

    /* === Garbage_collection, if necessary ============================= */

    needed_memory = COLAMD_MIN (pivot_col_score, n_col - k) ;
    if (pfree + needed_memory >= Alen)
    {
      pfree = Eigen::internal::garbage_collection (n_row, n_col, Row, Col, A, &A [pfree]) ;
      ngarbage++ ;
      /* after garbage collection we will have enough */
      COLAMD_ASSERT (pfree + needed_memory < Alen) ;
      /* garbage collection has wiped out the Row[].shared2.mark array */
      tag_mark = Eigen::internal::clear_mark (n_row, Row) ;

    }

    /* === Compute pivot row pattern ==================================== */

    /* get starting location for this new merged row */
    pivot_row_start = pfree ;

    /* initialize new row counts to zero */
    pivot_row_degree = 0 ;

    /* tag pivot column as having been visited so it isn't included */
    /* in merged pivot row */
    Col [pivot_col].shared1.thickness = -pivot_col_thickness ;

    /* pivot row is the union of all rows in the pivot column pattern */
    cp = &A [Col [pivot_col].start] ;
    cp_end = cp + Col [pivot_col].length ;
    while (cp < cp_end)
    {
      /* get a row */
      row = *cp++ ;
      COLAMD_DEBUG4 (("Pivot col pattern %d %d\n", ROW_IS_ALIVE (row), row)) ;
      /* skip if row is dead */
      if (ROW_IS_DEAD (row))
      {
	continue ;
      }
      rp = &A [Row [row].start] ;
      rp_end = rp + Row [row].length ;
      while (rp < rp_end)
      {
	/* get a column */
	col = *rp++ ;
	/* add the column, if alive and untagged */
	col_thickness = Col [col].shared1.thickness ;
	if (col_thickness > 0 && COL_IS_ALIVE (col))
	{
	  /* tag column in pivot row */
	  Col [col].shared1.thickness = -col_thickness ;
	  COLAMD_ASSERT (pfree < Alen) ;
	  /* place column in pivot row */
	  A [pfree++] = col ;
	  pivot_row_degree += col_thickness ;
	}
      }
    }

    /* clear tag on pivot column */
    Col [pivot_col].shared1.thickness = pivot_col_thickness ;
    max_deg = COLAMD_MAX (max_deg, pivot_row_degree) ;


    /* === Kill all rows used to construct pivot row ==================== */

    /* also kill pivot row, temporarily */
    cp = &A [Col [pivot_col].start] ;
    cp_end = cp + Col [pivot_col].length ;
    while (cp < cp_end)
    {
      /* may be killing an already dead row */
      row = *cp++ ;
      COLAMD_DEBUG3 (("Kill row in pivot col: %d\n", row)) ;
      KILL_ROW (row) ;
    }

    /* === Select a row index to use as the new pivot row =============== */

    pivot_row_length = pfree - pivot_row_start ;
    if (pivot_row_length > 0)
    {
      /* pick the "pivot" row arbitrarily (first row in col) */
      pivot_row = A [Col [pivot_col].start] ;
      COLAMD_DEBUG3 (("Pivotal row is %d\n", pivot_row)) ;
    }
    else
    {
      /* there is no pivot row, since it is of zero length */
      pivot_row = COLAMD_EMPTY ;
      COLAMD_ASSERT (pivot_row_length == 0) ;
    }
    COLAMD_ASSERT (Col [pivot_col].length > 0 || pivot_row_length == 0) ;

    /* === Approximate degree computation =============================== */

    /* Here begins the computation of the approximate degree.  The column */
    /* score is the sum of the pivot row "length", plus the size of the */
    /* set differences of each row in the column minus the pattern of the */
    /* pivot row itself.  The column ("thickness") itself is also */
    /* excluded from the column score (we thus use an approximate */
    /* external degree). */

    /* The time taken by the following code (compute set differences, and */
    /* add them up) is proportional to the size of the data structure */
    /* being scanned - that is, the sum of the sizes of each column in */
    /* the pivot row.  Thus, the amortized time to compute a column score */
    /* is proportional to the size of that column (where size, in this */
    /* context, is the column "length", or the number of row indices */
    /* in that column).  The number of row indices in a column is */
    /* monotonically non-decreasing, from the length of the original */
    /* column on input to colamd. */

    /* === Compute set differences ====================================== */

    COLAMD_DEBUG3 (("** Computing set differences phase. **\n")) ;

    /* pivot row is currently dead - it will be revived later. */

    COLAMD_DEBUG3 (("Pivot row: ")) ;
    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      col = *rp++ ;
      COLAMD_ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
      COLAMD_DEBUG3 (("Col: %d\n", col)) ;

      /* clear tags used to construct pivot row pattern */
      col_thickness = -Col [col].shared1.thickness ;
      COLAMD_ASSERT (col_thickness > 0) ;
      Col [col].shared1.thickness = col_thickness ;

      /* === Remove column from degree list =========================== */

      cur_score = Col [col].shared2.score ;
      prev_col = Col [col].shared3.prev ;
      next_col = Col [col].shared4.degree_next ;
      COLAMD_ASSERT (cur_score >= 0) ;
      COLAMD_ASSERT (cur_score <= n_col) ;
      COLAMD_ASSERT (cur_score >= COLAMD_EMPTY) ;
      if (prev_col == COLAMD_EMPTY)
      {
	head [cur_score] = next_col ;
      }
      else
      {
	Col [prev_col].shared4.degree_next = next_col ;
      }
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = prev_col ;
      }

      /* === Scan the column ========================================== */

      cp = &A [Col [col].start] ;
      cp_end = cp + Col [col].length ;
      while (cp < cp_end)
      {
	/* get a row */
	row = *cp++ ;
	row_mark = Row [row].shared2.mark ;
	/* skip if dead */
	if (ROW_IS_MARKED_DEAD (row_mark))
	{
	  continue ;
	}
	COLAMD_ASSERT (row != pivot_row) ;
	set_difference = row_mark - tag_mark ;
	/* check if the row has been seen yet */
	if (set_difference < 0)
	{
	  COLAMD_ASSERT (Row [row].shared1.degree <= max_deg) ;
	  set_difference = Row [row].shared1.degree ;
	}
	/* subtract column thickness from this row's set difference */
	set_difference -= col_thickness ;
	COLAMD_ASSERT (set_difference >= 0) ;
	/* absorb this row if the set difference becomes zero */
	if (set_difference == 0)
	{
	  COLAMD_DEBUG3 (("aggressive absorption. Row: %d\n", row)) ;
	  KILL_ROW (row) ;
	}
	else
	{
	  /* save the new mark */
	  Row [row].shared2.mark = set_difference + tag_mark ;
	}
      }
    }


    /* === Add up set differences for each column ======================= */

    COLAMD_DEBUG3 (("** Adding set differences phase. **\n")) ;

    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      /* get a column */
      col = *rp++ ;
      COLAMD_ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
      hash = 0 ;
      cur_score = 0 ;
      cp = &A [Col [col].start] ;
      /* compact the column */
      new_cp = cp ;
      cp_end = cp + Col [col].length ;

      COLAMD_DEBUG4 (("Adding set diffs for Col: %d.\n", col)) ;

      while (cp < cp_end)
      {
	/* get a row */
	row = *cp++ ;
	COLAMD_ASSERT(row >= 0 && row < n_row) ;
	row_mark = Row [row].shared2.mark ;
	/* skip if dead */
	if (ROW_IS_MARKED_DEAD (row_mark))
	{
	  continue ;
	}
	COLAMD_ASSERT (row_mark > tag_mark) ;
	/* compact the column */
	*new_cp++ = row ;
	/* compute hash function */
	hash += row ;
	/* add set difference */
	cur_score += row_mark - tag_mark ;
	/* integer overflow... */
	cur_score = COLAMD_MIN (cur_score, n_col) ;
      }

      /* recompute the column's length */
      Col [col].length = (Index) (new_cp - &A [Col [col].start]) ;

      /* === Further mass elimination ================================= */

      if (Col [col].length == 0)
      {
	COLAMD_DEBUG4 (("further mass elimination. Col: %d\n", col)) ;
	/* nothing left but the pivot row in this column */
	KILL_PRINCIPAL_COL (col) ;
	pivot_row_degree -= Col [col].shared1.thickness ;
	COLAMD_ASSERT (pivot_row_degree >= 0) ;
	/* order it */
	Col [col].shared2.order = k ;
	/* increment order count by column thickness */
	k += Col [col].shared1.thickness ;
      }
      else
      {
	/* === Prepare for supercolumn detection ==================== */

	COLAMD_DEBUG4 (("Preparing supercol detection for Col: %d.\n", col)) ;

	/* save score so far */
	Col [col].shared2.score = cur_score ;

	/* add column to hash table, for supercolumn detection */
	hash %= n_col + 1 ;

	COLAMD_DEBUG4 ((" Hash = %d, n_col = %d.\n", hash, n_col)) ;
	COLAMD_ASSERT (hash <= n_col) ;

	head_column = head [hash] ;
	if (head_column > COLAMD_EMPTY)
	{
	  /* degree list "hash" is non-empty, use prev (shared3) of */
	  /* first column in degree list as head of hash bucket */
	  first_col = Col [head_column].shared3.headhash ;
	  Col [head_column].shared3.headhash = col ;
	}
	else
	{
	  /* degree list "hash" is empty, use head as hash bucket */
	  first_col = - (head_column + 2) ;
	  head [hash] = - (col + 2) ;
	}
	Col [col].shared4.hash_next = first_col ;

	/* save hash function in Col [col].shared3.hash */
	Col [col].shared3.hash = (Index) hash ;
	COLAMD_ASSERT (COL_IS_ALIVE (col)) ;
      }
    }

    /* The approximate external column degree is now computed.  */

    /* === Supercolumn detection ======================================== */

    COLAMD_DEBUG3 (("** Supercolumn detection phase. **\n")) ;

    Eigen::internal::detect_super_cols (Col, A, head, pivot_row_start, pivot_row_length) ;

    /* === Kill the pivotal column ====================================== */

    KILL_PRINCIPAL_COL (pivot_col) ;

    /* === Clear mark =================================================== */

    tag_mark += (max_deg + 1) ;
    if (tag_mark >= max_mark)
    {
      COLAMD_DEBUG2 (("clearing tag_mark\n")) ;
      tag_mark = Eigen::internal::clear_mark (n_row, Row) ;
    }

    /* === Finalize the new pivot row, and column scores ================ */

    COLAMD_DEBUG3 (("** Finalize scores phase. **\n")) ;

    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    /* compact the pivot row */
    new_rp = rp ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      col = *rp++ ;
      /* skip dead columns */
      if (COL_IS_DEAD (col))
      {
	continue ;
      }
      *new_rp++ = col ;
      /* add new pivot row to column */
      A [Col [col].start + (Col [col].length++)] = pivot_row ;

      /* retrieve score so far and add on pivot row's degree. */
      /* (we wait until here for this in case the pivot */
      /* row's degree was reduced due to mass elimination). */
      cur_score = Col [col].shared2.score + pivot_row_degree ;

      /* calculate the max possible score as the number of */
      /* external columns minus the 'k' value minus the */
      /* columns thickness */
      max_score = n_col - k - Col [col].shared1.thickness ;

      /* make the score the external degree of the union-of-rows */
      cur_score -= Col [col].shared1.thickness ;

      /* make sure score is less or equal than the max score */
      cur_score = COLAMD_MIN (cur_score, max_score) ;
      COLAMD_ASSERT (cur_score >= 0) ;

      /* store updated score */
      Col [col].shared2.score = cur_score ;

      /* === Place column back in degree list ========================= */

      COLAMD_ASSERT (min_score >= 0) ;
      COLAMD_ASSERT (min_score <= n_col) ;
      COLAMD_ASSERT (cur_score >= 0) ;
      COLAMD_ASSERT (cur_score <= n_col) ;
      COLAMD_ASSERT (head [cur_score] >= COLAMD_EMPTY) ;
      next_col = head [cur_score] ;
      Col [col].shared4.degree_next = next_col ;
      Col [col].shared3.prev = COLAMD_EMPTY ;
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = col ;
      }
      head [cur_score] = col ;

      /* see if this score is less than current min */
      min_score = COLAMD_MIN (min_score, cur_score) ;

    }

    /* === Resurrect the new pivot row ================================== */

    if (pivot_row_degree > 0)
    {
      /* update pivot row length to reflect any cols that were killed */
      /* during super-col detection and mass elimination */
      Row [pivot_row].start  = pivot_row_start ;
      Row [pivot_row].length = (Index) (new_rp - &A[pivot_row_start]) ;
      Row [pivot_row].shared1.degree = pivot_row_degree ;
      Row [pivot_row].shared2.mark = 0 ;
      /* pivot row is no longer dead */
    }
  }

  /* === All principal columns have now been ordered ====================== */

  return (ngarbage) ;
}